

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcElectricFlowStorageDeviceType::~IfcElectricFlowStorageDeviceType
          (IfcElectricFlowStorageDeviceType *this,void **vtt)

{
  void **vtt_local;
  IfcElectricFlowStorageDeviceType *this_local;
  
  *(void **)&(this->super_IfcFlowStorageDeviceType).super_IfcDistributionFlowElementType.
             super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
             super_IfcTypeObject = *vtt;
  *(void **)((long)&(this->super_IfcFlowStorageDeviceType).super_IfcDistributionFlowElementType.
                    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
                    super_IfcTypeObject.field_0x0 +
            *(long *)(*(long *)&(this->super_IfcFlowStorageDeviceType).
                                super_IfcDistributionFlowElementType.
                                super_IfcDistributionElementType.super_IfcElementType.
                                super_IfcTypeProduct.super_IfcTypeObject + -0x18)) = vtt[0x3f];
  *(void **)&(this->super_IfcFlowStorageDeviceType).super_IfcDistributionFlowElementType.
             super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
             super_IfcTypeObject.field_0x88 = vtt[0x40];
  (this->super_IfcFlowStorageDeviceType).super_IfcDistributionFlowElementType.
  super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x41];
  *(void **)&(this->super_IfcFlowStorageDeviceType).super_IfcDistributionFlowElementType.
             super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
             super_IfcTypeObject.field_0xf0 = vtt[0x42];
  *(void **)&(this->super_IfcFlowStorageDeviceType).super_IfcDistributionFlowElementType.
             super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x148
       = vtt[0x43];
  *(void **)&(this->super_IfcFlowStorageDeviceType).super_IfcDistributionFlowElementType.
             super_IfcDistributionElementType.super_IfcElementType.field_0x180 = vtt[0x44];
  *(void **)&(this->super_IfcFlowStorageDeviceType).super_IfcDistributionFlowElementType.
             super_IfcDistributionElementType.super_IfcElementType.field_0x190 = vtt[0x45];
  *(void **)&(this->super_IfcFlowStorageDeviceType).super_IfcDistributionFlowElementType.
             super_IfcDistributionElementType.field_0x1a0 = vtt[0x46];
  *(void **)&(this->super_IfcFlowStorageDeviceType).super_IfcDistributionFlowElementType.field_0x1b0
       = vtt[0x47];
  std::__cxx11::string::~string((string *)&(this->super_IfcFlowStorageDeviceType).field_0x1c0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcElectricFlowStorageDeviceType,_1UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcElectricFlowStorageDeviceType,_1UL> *)
             &(this->super_IfcFlowStorageDeviceType).super_IfcDistributionFlowElementType.
              field_0x1b0,vtt + 0x3d);
  Schema_2x3::IfcFlowStorageDeviceType::~IfcFlowStorageDeviceType
            (&this->super_IfcFlowStorageDeviceType,vtt + 1);
  return;
}

Assistant:

IfcElectricFlowStorageDeviceType() : Object("IfcElectricFlowStorageDeviceType") {}